

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::
HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AsyncStreamFd>_>_>::
disposeImpl(HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AsyncStreamFd>_>_>
            *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    AttachmentPromiseNodeBase::dropDependency((AttachmentPromiseNodeBase *)pointer);
    Own<kj::(anonymous_namespace)::AsyncStreamFd>::~Own
              ((Own<kj::(anonymous_namespace)::AsyncStreamFd> *)((long)pointer + 0x18));
    AttachmentPromiseNodeBase::~AttachmentPromiseNodeBase((AttachmentPromiseNodeBase *)pointer);
  }
  operator_delete(pointer,0x28);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }